

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  long *__s1;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int64_t iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  pthread_mutex_t *__mutex;
  CompactionStats *pCVar7;
  long lVar8;
  int level;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint64_t level_1;
  char buf [200];
  Slice local_118;
  pthread_mutex_t *local_108;
  ulong local_100;
  string local_f8 [6];
  
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  __mutex = (pthread_mutex_t *)&this->mutex_;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_118.data_ = property->data_;
  local_118.size_ = property->size_;
  if ((7 < local_118.size_) && (*(long *)local_118.data_ == 0x2e62646c6576656c)) {
    __s1 = (long *)((long)local_118.data_ + 8);
    uVar9 = local_118.size_ - 8;
    if ((uVar9 < 0x12) ||
       (auVar10[0] = -((char)*__s1 == 'n'),
       auVar10[1] = -(*(char *)((long)local_118.data_ + 9) == 'u'),
       auVar10[2] = -(*(char *)((long)local_118.data_ + 10) == 'm'),
       auVar10[3] = -(*(char *)((long)local_118.data_ + 0xb) == '-'),
       auVar10[4] = -(*(char *)((long)local_118.data_ + 0xc) == 'f'),
       auVar10[5] = -(*(char *)((long)local_118.data_ + 0xd) == 'i'),
       auVar10[6] = -(*(char *)((long)local_118.data_ + 0xe) == 'l'),
       auVar10[7] = -(*(char *)((long)local_118.data_ + 0xf) == 'e'),
       auVar10[8] = -((char)*(long *)((long)local_118.data_ + 0x10) == 's'),
       auVar10[9] = -(*(char *)((long)local_118.data_ + 0x11) == '-'),
       auVar10[10] = -(*(char *)((long)local_118.data_ + 0x12) == 'a'),
       auVar10[0xb] = -(*(char *)((long)local_118.data_ + 0x13) == 't'),
       auVar10[0xc] = -(*(char *)((long)local_118.data_ + 0x14) == '-'),
       auVar10[0xd] = -(*(char *)((long)local_118.data_ + 0x15) == 'l'),
       auVar10[0xe] = -(*(char *)((long)local_118.data_ + 0x16) == 'e'),
       auVar10[0xf] = -(*(char *)((long)local_118.data_ + 0x17) == 'v'),
       auVar11[0] = -((char)(short)*(long *)((long)local_118.data_ + 0x18) == 'e'),
       auVar11[1] = -((char)((ushort)(short)*(long *)((long)local_118.data_ + 0x18) >> 8) == 'l'),
       auVar11[2] = 0xff, auVar11[3] = 0xff, auVar11[4] = 0xff, auVar11[5] = 0xff, auVar11[6] = 0xff
       , auVar11[7] = 0xff, auVar11[8] = 0xff, auVar11[9] = 0xff, auVar11[10] = 0xff,
       auVar11[0xb] = 0xff, auVar11[0xc] = 0xff, auVar11[0xd] = 0xff, auVar11[0xe] = 0xff,
       auVar11[0xf] = 0xff, auVar11 = auVar11 & auVar10,
       (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff)) {
      if (local_118.size_ == 0x20) {
        iVar3 = bcmp(__s1,"approximate-memory-usage",uVar9);
        if (iVar3 == 0) {
          iVar3 = (*((this->options_).block_cache)->_vptr_Cache[9])();
          lVar8 = CONCAT44(extraout_var,iVar3);
          if (this->mem_ != (MemTable *)0x0) {
            sVar6 = MemTable::ApproximateMemoryUsage(this->mem_);
            lVar8 = lVar8 + sVar6;
          }
          if (this->imm_ != (MemTable *)0x0) {
            sVar6 = MemTable::ApproximateMemoryUsage(this->imm_);
            lVar8 = lVar8 + sVar6;
          }
          snprintf((char *)local_f8,0x32,"%llu",lVar8);
          std::__cxx11::string::append((char *)value);
          goto LAB_001107cf;
        }
      }
      else if (local_118.size_ == 0x10) {
        iVar3 = bcmp(__s1,"sstables",uVar9);
        if (iVar3 == 0) {
          Version::DebugString_abi_cxx11_(local_f8,this->versions_->current_);
          std::__cxx11::string::operator=((string *)value,(string *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
            operator_delete(local_f8[0]._M_dataplus._M_p);
          }
          goto LAB_001107cf;
        }
      }
      else if (local_118.size_ == 0xd) {
        iVar3 = bcmp(__s1,"stats",uVar9);
        if (iVar3 == 0) {
          local_108 = __mutex;
          memcpy(local_f8,
                 "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
                 ,0x92);
          std::__cxx11::string::append((char *)value);
          pCVar7 = this->stats_;
          uVar9 = 0;
          do {
            uVar4 = VersionSet::NumLevelFiles(this->versions_,(int)uVar9);
            if ((0 < (int)uVar4) || (0 < pCVar7->micros)) {
              iVar5 = VersionSet::NumLevelBytes(this->versions_,(int)uVar9);
              snprintf((char *)local_f8,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                       (double)iVar5 * 9.5367431640625e-07,(double)pCVar7->micros / 1000000.0,
                       (double)pCVar7->bytes_read * 9.5367431640625e-07,
                       (double)pCVar7->bytes_written * 9.5367431640625e-07,uVar9 & 0xffffffff,
                       (ulong)uVar4);
              std::__cxx11::string::append((char *)value);
            }
            uVar9 = uVar9 + 1;
            pCVar7 = pCVar7 + 1;
          } while (uVar9 != 7);
          bVar2 = true;
          __mutex = local_108;
          goto LAB_00110506;
        }
      }
    }
    else {
      local_118.data_ = (char *)((long)local_118.data_ + 0x1a);
      local_118.size_ = local_118.size_ - 0x1a;
      bVar2 = ConsumeDecimalNumber(&local_118,&local_100);
      if ((bVar2) && (local_100 < 7 && local_118.size_ == 0)) {
        uVar4 = VersionSet::NumLevelFiles(this->versions_,(int)local_100);
        snprintf((char *)local_f8,100,"%d",(ulong)uVar4);
        pcVar1 = (char *)value->_M_string_length;
        strlen((char *)local_f8);
        std::__cxx11::string::_M_replace((ulong)value,0,pcVar1,(ulong)local_f8);
LAB_001107cf:
        bVar2 = true;
        goto LAB_00110506;
      }
    }
  }
  bVar2 = false;
LAB_00110506:
  pthread_mutex_unlock(__mutex);
  return bVar2;
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "%d",
                    versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    std::snprintf(buf, sizeof(buf),
                  "                               Compactions\n"
                  "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
                  "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        std::snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                      level, files, versions_->NumLevelBytes(level) / 1048576.0,
                      stats_[level].micros / 1e6,
                      stats_[level].bytes_read / 1048576.0,
                      stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    std::snprintf(buf, sizeof(buf), "%llu",
                  static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}